

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx2_gemm.h
# Opt level: O1

void intgemm::AVX2::Kernels16::Quantize(float *input,int16_t *output,float quant_mult,Index size)

{
  float *pfVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long lVar4;
  undefined1 in_ZMM1 [64];
  undefined1 auVar5 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar6 [64];
  
  if (size != 0) {
    lVar4 = 0;
    do {
      pfVar1 = (float *)((long)input + lVar4 * 2);
      auVar5._0_4_ = quant_mult * *pfVar1;
      auVar5._4_4_ = quant_mult * pfVar1[1];
      auVar5._8_4_ = quant_mult * pfVar1[2];
      auVar5._12_4_ = quant_mult * pfVar1[3];
      auVar5._16_4_ = quant_mult * pfVar1[4];
      auVar5._20_4_ = quant_mult * pfVar1[5];
      auVar5._28_36_ = in_ZMM1._28_36_;
      auVar5._24_4_ = quant_mult * pfVar1[6];
      auVar2 = vcvtps2dq_avx(auVar5._0_32_);
      auVar6._0_4_ = quant_mult * pfVar1[8];
      auVar6._4_4_ = quant_mult * pfVar1[9];
      auVar6._8_4_ = quant_mult * pfVar1[10];
      auVar6._12_4_ = quant_mult * pfVar1[0xb];
      auVar6._16_4_ = quant_mult * pfVar1[0xc];
      auVar6._20_4_ = quant_mult * pfVar1[0xd];
      auVar6._28_36_ = in_ZMM2._28_36_;
      auVar6._24_4_ = quant_mult * pfVar1[0xe];
      auVar3 = vcvtps2dq_avx(auVar6._0_32_);
      in_ZMM2 = ZEXT3264(auVar3);
      auVar2 = vpackssdw_avx2(auVar2,auVar3);
      auVar2 = vpermq_avx2(auVar2,0xd8);
      in_ZMM1 = ZEXT3264(auVar2);
      *(undefined1 (*) [32])((long)output + lVar4) = auVar2;
      lVar4 = lVar4 + 0x20;
    } while (pfVar1 + 0x10 != input + size);
  }
  return;
}

Assistant:

INTGEMM_AVX2 static void Quantize(const float *input, int16_t *output, float quant_mult, Index size) {
    assert(size % 16 == 0);
    assert(reinterpret_cast<uintptr_t>(input) % 32 == 0);
    FRegister q = set1_ps<FRegister>(quant_mult);
    const float *end = input + size;
    for (; input != end; input += 16, output += 16) {
      *reinterpret_cast<__m256i*>(output) = QuantizeTile16::Consecutive(q, input);
    }
  }